

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

tuple<pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_std::error_code>
* __thiscall
pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::consume_normal_state
          (tuple<pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_std::error_code>
           *__return_storage_ptr__,string_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,char32_t code_point,appender *app)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  rule *prVar3;
  _func_int **pp_Var4;
  int iVar5;
  error_category *peVar6;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  *puVar7;
  error_category *extraout_RDX;
  error_category *extraout_RDX_00;
  state sVar8;
  
  peVar6 = (error_category *)std::_V2::system_category();
  if (code_point == L'\\') {
    sVar8 = escape_state;
LAB_00117eaa:
    iVar5 = 0;
  }
  else {
    if (code_point == L'\"') {
      if (app->high_surrogate_ == L'\0') {
        cVar1 = (this->super_matcher<pstore::exchange::import_ns::callbacks>).field_0xc;
        pbVar2 = (app->result_).ptr_;
        puVar7 = exchange::import_ns::callbacks::top(&parser->callbacks_);
        prVar3 = (puVar7->_M_t).
                 super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
                 .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl;
        pp_Var4 = prVar3->_vptr_rule;
        if (cVar1 == '\x01') {
          iVar5 = (*pp_Var4[0xc])();
          peVar6 = extraout_RDX;
        }
        else {
          iVar5 = (*pp_Var4[6])(prVar3,pbVar2);
          peVar6 = extraout_RDX_00;
        }
        sVar8 = done_state;
        goto LAB_00117f07;
      }
      sVar8 = done_state;
    }
    else {
      if ((0x1f < (uint)code_point) && (app->high_surrogate_ == L'\0')) {
        utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>
                  (code_point,(app->result_).ptr_);
        sVar8 = normal_char_state;
        goto LAB_00117eaa;
      }
      sVar8 = normal_char_state;
    }
    iVar5 = 0xd;
    peVar6 = get_error_category();
  }
LAB_00117f07:
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_std::error_code>
  ).super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
  _M_head_impl._M_value = iVar5;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_std::error_code>
  ).super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
  _M_head_impl._M_cat = peVar6;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_std::error_code>
  ).
  super__Head_base<0UL,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state,_false>
  ._M_head_impl = sVar8;
  return __return_storage_ptr__;
}

Assistant:

auto string_matcher<Callbacks>::consume_normal_state (parser<Callbacks> & parser,
                                                                  char32_t code_point,
                                                                  appender & app)
                -> std::tuple<state, std::error_code> {
                state next_state = normal_char_state;
                std::error_code error;

                if (code_point == '"') {
                    if (app.has_high_surrogate ()) {
                        error = error_code::bad_unicode_code_point;
                    } else {
                        // Consume the closing quote character.
                        if (object_key_) {
                            error = parser.callbacks ().key (*app.result ());
                        } else {
                            error = parser.callbacks ().string_value (*app.result ());
                        }
                    }
                    next_state = done_state;
                } else if (code_point == '\\') {
                    next_state = escape_state;
                } else if (code_point <= 0x1F) {
                    // Control characters U+0000 through U+001F MUST be escaped.
                    error = error_code::bad_unicode_code_point;
                } else {
                    if (!app.append32 (code_point)) {
                        error = error_code::bad_unicode_code_point;
                    }
                }

                return std::make_tuple (next_state, error);
            }